

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_1030c25::NotInProjectDir::operator()(NotInProjectDir *this,string *p)

{
  bool bVar1;
  bool local_141;
  cmCMakePath local_100;
  size_t local_d8;
  char *pcStack_d0;
  cmCMakePath local_c8;
  undefined4 local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  cmCMakePath local_70;
  undefined1 local_48 [8];
  cmCMakePath path;
  string *p_local;
  NotInProjectDir *this_local;
  
  path.Path._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          )p;
  std::__cxx11::string::string((string *)&local_90,(string *)p);
  cmCMakePath::cmCMakePath<std::__cxx11::string,cmCMakePath&>(&local_70,&local_90,generic_format);
  cmCMakePath::Normal((cmCMakePath *)local_48,&local_70);
  cmCMakePath::~cmCMakePath(&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  bVar1 = cmCMakePath::IsRelative((cmCMakePath *)local_48);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    local_d8 = (this->SourceDir)._M_len;
    pcStack_d0 = (this->SourceDir)._M_str;
    cmCMakePath::cmCMakePath(&local_c8,this->SourceDir,generic_format);
    bVar1 = cmCMakePath::IsPrefix(&local_c8,(cmCMakePath *)local_48);
    local_141 = true;
    if (!bVar1) {
      cmCMakePath::cmCMakePath(&local_100,this->BinaryDir,generic_format);
      local_141 = cmCMakePath::IsPrefix(&local_100,(cmCMakePath *)local_48);
    }
    this_local._7_1_ = (bool)((local_141 ^ 0xffU) & 1);
    if (!bVar1) {
      cmCMakePath::~cmCMakePath(&local_100);
    }
    cmCMakePath::~cmCMakePath(&local_c8);
  }
  local_a0 = 1;
  cmCMakePath::~cmCMakePath((cmCMakePath *)local_48);
  return this_local._7_1_;
}

Assistant:

bool operator()(const std::string& p) const
  {
    auto path = cmCMakePath(p).Normal();

    // Keep all relative paths:
    if (path.IsRelative()) {
      return false;
    }

    // If it's an absolute path, check if it starts with the source
    // directory:
    return !(cmCMakePath(this->SourceDir).IsPrefix(path) ||
             cmCMakePath(this->BinaryDir).IsPrefix(path));
  }